

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BoardView.cpp
# Opt level: O2

void __thiscall BoardView::CenterView(BoardView *this)

{
  undefined4 uVar1;
  undefined4 uVar2;
  uint uVar3;
  uint uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  float fVar7;
  float fVar8;
  
  auVar5._8_8_ = 0;
  auVar5._0_4_ = (this->m_board_surface).x;
  auVar5._4_4_ = (this->m_board_surface).y;
  uVar1 = this->m_boardWidth;
  uVar2 = this->m_boardHeight;
  uVar3 = -(uint)(0.0 < (float)(int)uVar1 * 1.1);
  uVar4 = -(uint)(0.0 < (float)(int)uVar2 * 1.1);
  auVar6._4_4_ = (float)(int)uVar2 * 1.1;
  auVar6._0_4_ = (float)(int)uVar1 * 1.1;
  auVar6._8_8_ = 0;
  auVar6 = divps(auVar5,auVar6);
  fVar7 = (float)(~uVar3 & 0x3f800000 | auVar6._0_4_ & uVar3);
  fVar8 = (float)(~uVar4 & 0x3f800000 | auVar6._4_4_ & uVar4);
  if (fVar8 <= fVar7) {
    fVar7 = fVar8;
  }
  this->m_scale = fVar7;
  this->m_scale_floor = fVar7;
  SetTarget(this,this->m_mx,this->m_my);
  this->m_needsRedraw = true;
  return;
}

Assistant:

void BoardView::CenterView(void) {
	// ImVec2 view = ImGui::GetIO().DisplaySize;
	ImVec2 view = m_board_surface;

	float dx = 1.1f * (m_boardWidth);
	float dy = 1.1f * (m_boardHeight);
	float sx = dx > 0 ? view.x / dx : 1.0f;
	float sy = dy > 0 ? view.y / dy : 1.0f;

	//  m_rotation = 0;
	m_scale_floor = m_scale = sx < sy ? sx : sy;
	SetTarget(m_mx, m_my);
	m_needsRedraw = true;
}